

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

void env_container_put(Container c,int line,Environment *env)

{
  Object value;
  undefined4 uStack_5c;
  Object o;
  Record *match;
  Environment *env_local;
  int line_local;
  
  o.field_1.routine.code.statements = (Statement *)env_match(c.name,env);
  if ((Record *)o.field_1.routine.code.statements != (Record *)0x0) {
    if ((((Record *)o.field_1.routine.code.statements)->object).type == OBJECT_CONTAINER) {
      printf("\x1b[31m\n[Runtime Error] [Line:%d] Container %s is already defined!\x1b[0m",
             (ulong)(uint)line,c.name);
    }
    else {
      printf("\x1b[31m\n[Runtime Error] [Line:%d] Identifer %s cannot be redefined as a container in the same scope!\x1b[0m"
             ,(ulong)(uint)line,c.name);
    }
    stop();
  }
  memcpy(&o,&c,0x30);
  value._4_4_ = uStack_5c;
  value.type = 4;
  value.field_1.instance = (Instance *)o._0_8_;
  value.field_1._8_8_ = o.field_1.instance;
  value.field_1._16_8_ = o.field_1.arr.values;
  value.field_1._24_8_ = o.field_1._16_8_;
  value.field_1._32_8_ = o.field_1.routine.arguments;
  value.field_1._40_8_ = o.field_1._32_8_;
  value.field_1.routine.code.statements = o.field_1.container.constructor.statements;
  rec_new(c.name,value,env);
  return;
}

Assistant:

void env_container_put(Container c, int line, Environment *env){
    Record *match = env_match(c.name, env);
    if(match != NULL){
        if(match->object.type != OBJECT_CONTAINER){
            printf(runtime_error("Identifer %s cannot be redefined as a container in the same scope!"), line, c.name);
        }
        else{
            printf(runtime_error("Container %s is already defined!"), line, c.name);
        }
        stop();
    }

    Object o;
    o.type = OBJECT_CONTAINER;
    o.container = c;

    rec_new(c.name, o, env);
}